

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O2

int64_t av1_lowbd_pixel_proj_error_avx2
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  uint uVar12;
  long lVar13;
  int *piVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      lVar8 = 0;
      if (height < 1) {
        height = 0;
      }
      auVar16 = ZEXT1664((undefined1  [16])0x0);
      for (iVar6 = 0; iVar6 != height; iVar6 = iVar6 + 1) {
        pbVar10 = dat8;
        pbVar11 = src8;
        for (lVar13 = 0; lVar13 <= width + -0x10; lVar13 = lVar13 + 0x10) {
          auVar15 = vpmovzxbw_avx2(*(undefined1 (*) [16])(dat8 + lVar13));
          auVar20 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src8 + lVar13));
          auVar15 = vpsubw_avx2(auVar15,auVar20);
          auVar15 = vpmaddwd_avx2(auVar15,auVar15);
          auVar15 = vpaddd_avx2(auVar15,auVar16._0_32_);
          auVar16 = ZEXT3264(auVar15);
          pbVar11 = pbVar11 + 0x10;
          pbVar10 = pbVar10 + 0x10;
        }
        for (; lVar13 < width; lVar13 = lVar13 + 1) {
          lVar8 = lVar8 + ((ulong)*pbVar10 - (ulong)*pbVar11) * ((ulong)*pbVar10 - (ulong)*pbVar11);
          pbVar11 = pbVar11 + 1;
          pbVar10 = pbVar10 + 1;
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
      }
      auVar15 = vpmovsxdq_avx2(auVar16._0_16_);
      auVar20 = vpmovsxdq_avx2(auVar16._16_16_);
      auVar15 = vpaddq_avx2(auVar15,auVar20);
      goto LAB_003f32c1;
    }
    lVar8 = 4;
    flt0 = flt1;
    flt0_stride = flt1_stride;
  }
  else {
    if (0 < params->r[1]) {
      uVar12 = xq[1] << 0x10 | *xq & 0xffffU;
      auVar20._4_4_ = uVar12;
      auVar20._0_4_ = uVar12;
      auVar20._8_4_ = uVar12;
      auVar20._12_4_ = uVar12;
      auVar20._16_4_ = uVar12;
      auVar20._20_4_ = uVar12;
      auVar20._24_4_ = uVar12;
      auVar20._28_4_ = uVar12;
      if (height < 1) {
        height = 0;
      }
      auVar16 = ZEXT1664((undefined1  [16])0x0);
      auVar17._8_4_ = 0x400;
      auVar17._0_8_ = 0x40000000400;
      auVar17._12_4_ = 0x400;
      auVar17._16_4_ = 0x400;
      auVar17._20_4_ = 0x400;
      auVar17._24_4_ = 0x400;
      auVar17._28_4_ = 0x400;
      lVar8 = 0;
      for (iVar6 = 0; auVar15 = auVar16._0_32_, iVar6 != height; iVar6 = iVar6 + 1) {
        auVar16 = ZEXT1664((undefined1  [16])0x0);
        piVar7 = flt0;
        pbVar10 = src8;
        pbVar11 = dat8;
        piVar14 = flt1;
        for (lVar13 = 0; lVar13 <= width + -0x10; lVar13 = lVar13 + 0x10) {
          auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(dat8 + lVar13));
          auVar5 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src8 + lVar13));
          auVar19 = vpackssdw_avx2(*(undefined1 (*) [32])(flt0 + lVar13),
                                   *(undefined1 (*) [32])(flt0 + lVar13 + 8));
          auVar18 = vpackssdw_avx2(*(undefined1 (*) [32])(flt1 + lVar13),
                                   *(undefined1 (*) [32])(flt1 + lVar13 + 8));
          auVar22 = vpsllw_avx2(auVar4,4);
          auVar19 = vpermq_avx2(auVar19,0xd8);
          auVar21 = vpsubw_avx2(auVar19,auVar22);
          auVar19 = vpermq_avx2(auVar18,0xd8);
          auVar18 = vpsubw_avx2(auVar19,auVar22);
          auVar19 = vpunpcklwd_avx2(auVar21,auVar18);
          auVar19 = vpmaddwd_avx2(auVar19,auVar20);
          auVar18 = vpunpckhwd_avx2(auVar21,auVar18);
          auVar18 = vpmaddwd_avx2(auVar20,auVar18);
          auVar19 = vpaddd_avx2(auVar19,auVar17);
          auVar21 = vpsrad_avx2(auVar19,0xb);
          auVar19 = vpaddd_avx2(auVar18,auVar17);
          auVar19 = vpsrad_avx2(auVar19,0xb);
          auVar19 = vpackssdw_avx2(auVar21,auVar19);
          auVar18 = vpsubw_avx2(auVar4,auVar5);
          auVar19 = vpaddw_avx2(auVar18,auVar19);
          auVar19 = vpmaddwd_avx2(auVar19,auVar19);
          auVar19 = vpaddd_avx2(auVar19,auVar16._0_32_);
          auVar16 = ZEXT3264(auVar19);
          pbVar10 = pbVar10 + 0x10;
          piVar14 = piVar14 + 0x10;
          piVar7 = piVar7 + 0x10;
          pbVar11 = pbVar11 + 0x10;
        }
        for (; lVar13 < width; lVar13 = lVar13 + 1) {
          bVar1 = *pbVar11;
          lVar9 = (long)(int)(((uint)bVar1 - (uint)*pbVar10) +
                             ((int)((*piVar14 + (uint)bVar1 * -0x10) * xq[1] + 0x400 +
                                   (*piVar7 + (uint)bVar1 * -0x10) * *xq) >> 0xb));
          lVar8 = lVar8 + lVar9 * lVar9;
          pbVar10 = pbVar10 + 1;
          piVar14 = piVar14 + 1;
          piVar7 = piVar7 + 1;
          pbVar11 = pbVar11 + 1;
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        auVar19 = vpmovsxdq_avx2(auVar16._0_16_);
        auVar18 = vpmovsxdq_avx2(auVar16._16_16_);
        auVar15 = vpaddq_avx2(auVar15,auVar19);
        auVar15 = vpaddq_avx2(auVar15,auVar18);
        auVar16 = ZEXT3264(auVar15);
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
      }
      goto LAB_003f32c1;
    }
    lVar8 = 0;
  }
  uVar12 = *(uint *)((long)xq + lVar8);
  iVar6 = (uVar12 & 0xffff) + uVar12 * -0x100000;
  auVar19._4_4_ = iVar6;
  auVar19._0_4_ = iVar6;
  auVar19._8_4_ = iVar6;
  auVar19._12_4_ = iVar6;
  auVar19._16_4_ = iVar6;
  auVar19._20_4_ = iVar6;
  auVar19._24_4_ = iVar6;
  auVar19._28_4_ = iVar6;
  lVar8 = 0;
  if (height < 1) {
    height = 0;
  }
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  auVar18._8_4_ = 0x400;
  auVar18._0_8_ = 0x40000000400;
  auVar18._12_4_ = 0x400;
  auVar18._16_4_ = 0x400;
  auVar18._20_4_ = 0x400;
  auVar18._24_4_ = 0x400;
  auVar18._28_4_ = 0x400;
  for (iVar6 = 0; auVar15 = auVar16._0_32_, iVar6 != height; iVar6 = iVar6 + 1) {
    auVar16 = ZEXT1664((undefined1  [16])0x0);
    pbVar10 = dat8;
    piVar7 = flt0;
    pbVar11 = src8;
    for (lVar13 = 0; lVar13 <= width + -0x10; lVar13 = lVar13 + 0x10) {
      auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(dat8 + lVar13));
      auVar5 = vpmovzxbw_avx2(*(undefined1 (*) [16])(src8 + lVar13));
      auVar20 = vpackssdw_avx2(*(undefined1 (*) [32])(flt0 + lVar13),
                               *(undefined1 (*) [32])(flt0 + lVar13 + 8));
      auVar17 = vpermq_avx2(auVar20,0xd8);
      auVar20 = vpunpcklwd_avx2(auVar17,auVar4);
      auVar20 = vpmaddwd_avx2(auVar19,auVar20);
      auVar17 = vpunpckhwd_avx2(auVar17,auVar4);
      auVar17 = vpmaddwd_avx2(auVar19,auVar17);
      auVar20 = vpaddd_avx2(auVar20,auVar18);
      auVar21 = vpsrad_avx2(auVar20,0xb);
      auVar20 = vpaddd_avx2(auVar17,auVar18);
      auVar20 = vpsrad_avx2(auVar20,0xb);
      auVar20 = vpackssdw_avx2(auVar21,auVar20);
      auVar17 = vpsubw_avx2(auVar4,auVar5);
      auVar20 = vpaddw_avx2(auVar17,auVar20);
      auVar20 = vpmaddwd_avx2(auVar20,auVar20);
      auVar20 = vpaddd_avx2(auVar20,auVar16._0_32_);
      auVar16 = ZEXT3264(auVar20);
      pbVar11 = pbVar11 + 0x10;
      piVar7 = piVar7 + 0x10;
      pbVar10 = pbVar10 + 0x10;
    }
    for (; lVar13 < width; lVar13 = lVar13 + 1) {
      lVar9 = (long)(int)(((uint)*pbVar10 - (uint)*pbVar11) +
                         ((int)((*piVar7 + (uint)*pbVar10 * -0x10) * uVar12 + 0x400) >> 0xb));
      lVar8 = lVar8 + lVar9 * lVar9;
      pbVar11 = pbVar11 + 1;
      piVar7 = piVar7 + 1;
      pbVar10 = pbVar10 + 1;
    }
    dat8 = dat8 + dat_stride;
    src8 = src8 + src_stride;
    auVar20 = vpmovsxdq_avx2(auVar16._0_16_);
    auVar17 = vpmovsxdq_avx2(auVar16._16_16_);
    auVar15 = vpaddq_avx2(auVar15,auVar20);
    auVar15 = vpaddq_avx2(auVar15,auVar17);
    auVar16 = ZEXT3264(auVar15);
    flt0 = flt0 + flt0_stride;
  }
LAB_003f32c1:
  auVar2 = vpaddq_avx(auVar15._0_16_,auVar15._16_16_);
  auVar3 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddq_avx(auVar2,auVar3);
  return auVar2._0_8_ + lVar8;
}

Assistant:

int64_t av1_lowbd_pixel_proj_error_avx2(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m256i rounding = _mm256_set1_epi32(1 << (shift - 1));
  __m256i sum64 = _mm256_setzero_si256();
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {
    __m256i xq_coeff = pair_set_epi16(xq[0], xq[1]);
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 16; j += 16) {
        const __m256i d0 = _mm256_cvtepu8_epi16(xx_loadu_128(dat + j));
        const __m256i s0 = _mm256_cvtepu8_epi16(xx_loadu_128(src + j));
        const __m256i flt0_16b = _mm256_permute4x64_epi64(
            _mm256_packs_epi32(yy_loadu_256(flt0 + j),
                               yy_loadu_256(flt0 + j + 8)),
            0xd8);
        const __m256i flt1_16b = _mm256_permute4x64_epi64(
            _mm256_packs_epi32(yy_loadu_256(flt1 + j),
                               yy_loadu_256(flt1 + j + 8)),
            0xd8);
        const __m256i u0 = _mm256_slli_epi16(d0, SGRPROJ_RST_BITS);
        const __m256i flt0_0_sub_u = _mm256_sub_epi16(flt0_16b, u0);
        const __m256i flt1_0_sub_u = _mm256_sub_epi16(flt1_16b, u0);
        const __m256i v0 = _mm256_madd_epi16(
            xq_coeff, _mm256_unpacklo_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m256i v1 = _mm256_madd_epi16(
            xq_coeff, _mm256_unpackhi_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m256i vr0 =
            _mm256_srai_epi32(_mm256_add_epi32(v0, rounding), shift);
        const __m256i vr1 =
            _mm256_srai_epi32(_mm256_add_epi32(v1, rounding), shift);
        const __m256i e0 = _mm256_sub_epi16(
            _mm256_add_epi16(_mm256_packs_epi32(vr0, vr1), d0), s0);
        const __m256i err0 = _mm256_madd_epi16(e0, e0);
        sum32 = _mm256_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
      const __m256i sum64_0 =
          _mm256_cvtepi32_epi64(_mm256_castsi256_si128(sum32));
      const __m256i sum64_1 =
          _mm256_cvtepi32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum64_0);
      sum64 = _mm256_add_epi64(sum64, sum64_1);
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {
    const int xq_active = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m256i xq_coeff =
        pair_set_epi16(xq_active, -xq_active * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m256i sum32 = _mm256_setzero_si256();
      for (j = 0; j <= width - 16; j += 16) {
        const __m256i d0 = _mm256_cvtepu8_epi16(xx_loadu_128(dat + j));
        const __m256i s0 = _mm256_cvtepu8_epi16(xx_loadu_128(src + j));
        const __m256i flt_16b = _mm256_permute4x64_epi64(
            _mm256_packs_epi32(yy_loadu_256(flt + j),
                               yy_loadu_256(flt + j + 8)),
            0xd8);
        const __m256i v0 =
            _mm256_madd_epi16(xq_coeff, _mm256_unpacklo_epi16(flt_16b, d0));
        const __m256i v1 =
            _mm256_madd_epi16(xq_coeff, _mm256_unpackhi_epi16(flt_16b, d0));
        const __m256i vr0 =
            _mm256_srai_epi32(_mm256_add_epi32(v0, rounding), shift);
        const __m256i vr1 =
            _mm256_srai_epi32(_mm256_add_epi32(v1, rounding), shift);
        const __m256i e0 = _mm256_sub_epi16(
            _mm256_add_epi16(_mm256_packs_epi32(vr0, vr1), d0), s0);
        const __m256i err0 = _mm256_madd_epi16(e0, e0);
        sum32 = _mm256_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_active * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
      const __m256i sum64_0 =
          _mm256_cvtepi32_epi64(_mm256_castsi256_si128(sum32));
      const __m256i sum64_1 =
          _mm256_cvtepi32_epi64(_mm256_extracti128_si256(sum32, 1));
      sum64 = _mm256_add_epi64(sum64, sum64_0);
      sum64 = _mm256_add_epi64(sum64, sum64_1);
    }
  } else {
    __m256i sum32 = _mm256_setzero_si256();
    for (i = 0; i < height; ++i) {
      for (j = 0; j <= width - 16; j += 16) {
        const __m256i d0 = _mm256_cvtepu8_epi16(xx_loadu_128(dat + j));
        const __m256i s0 = _mm256_cvtepu8_epi16(xx_loadu_128(src + j));
        const __m256i diff0 = _mm256_sub_epi16(d0, s0);
        const __m256i err0 = _mm256_madd_epi16(diff0, diff0);
        sum32 = _mm256_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
    const __m256i sum64_0 =
        _mm256_cvtepi32_epi64(_mm256_castsi256_si128(sum32));
    const __m256i sum64_1 =
        _mm256_cvtepi32_epi64(_mm256_extracti128_si256(sum32, 1));
    sum64 = _mm256_add_epi64(sum64_0, sum64_1);
  }
  int64_t sum[4];
  yy_storeu_256(sum, sum64);
  err += sum[0] + sum[1] + sum[2] + sum[3];
  return err;
}